

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlSaveFileTo(xmlOutputBufferPtr buf,xmlDocPtr cur,char *encoding)

{
  int iVar1;
  xmlSaveCtxt ctxt;
  xmlSaveCtxt xStack_c8;
  
  iVar1 = -1;
  if (buf != (xmlOutputBufferPtr)0x0) {
    if (cur == (xmlDocPtr)0x0) {
      xmlOutputBufferClose(buf);
    }
    else {
      memset(&xStack_c8,0,0xa0);
      xStack_c8.level = 0;
      xStack_c8.format = 0;
      xStack_c8.encoding = (xmlChar *)encoding;
      xStack_c8.buf = buf;
      xmlSaveCtxtInit(&xStack_c8);
      xStack_c8.options._0_1_ = (byte)xStack_c8.options | 0x20;
      xmlDocContentDumpOutput(&xStack_c8,cur);
      iVar1 = xmlOutputBufferClose(buf);
    }
  }
  return iVar1;
}

Assistant:

int
xmlSaveFileTo(xmlOutputBufferPtr buf, xmlDocPtr cur, const char *encoding) {
    xmlSaveCtxt ctxt;
    int ret;

    if (buf == NULL) return(-1);
    if (cur == NULL) {
        xmlOutputBufferClose(buf);
	return(-1);
    }
    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = 0;
    ctxt.format = 0;
    ctxt.encoding = (const xmlChar *) encoding;
    xmlSaveCtxtInit(&ctxt);
    ctxt.options |= XML_SAVE_AS_XML;
    xmlDocContentDumpOutput(&ctxt, cur);
    ret = xmlOutputBufferClose(buf);
    return(ret);
}